

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::tracker_logger::debug_log(tracker_logger *this,char *fmt,...)

{
  char in_AL;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  exception *anon_var_0;
  va_list v;
  char *local_18;
  char *fmt_local;
  tracker_logger *this_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  local_18 = fmt;
  fmt_local = (char *)this;
  iVar2 = (*(this->m_ses->super_session_logger)._vptr_session_logger[5])();
  bVar1 = alert_manager::should_post<libtorrent::log_alert>
                    ((alert_manager *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    v[0].overflow_arg_area = local_108;
    v[0]._0_8_ = &stack0x00000008;
    anon_var_0._4_4_ = 0x30;
    anon_var_0._0_4_ = 0x10;
    iVar2 = (*(this->m_ses->super_session_logger)._vptr_session_logger[5])();
    alert_manager::emplace_alert<libtorrent::log_alert,char_const*&,__va_list_tag(&)[1]>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar2),&local_18,
               (__va_list_tag (*) [1])&anon_var_0);
  }
  return;
}

Assistant:

void tracker_logger::debug_log(const char* fmt, ...) const noexcept try
		{
			if (!m_ses.alerts().should_post<log_alert>()) return;

			va_list v;
			va_start(v, fmt);
			m_ses.alerts().emplace_alert<log_alert>(fmt, v);
			va_end(v);
		}
		catch (std::exception const&) {}